

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O0

pair<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>
* embree::bezier_to_hermite_helper
            (vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
             *indices,avector<Vec3ff> *positions)

{
  undefined8 uVar1;
  ulong uVar2;
  ulong uVar3;
  size_type sVar4;
  unsigned_long *puVar5;
  const_reference pvVar6;
  long in_RDX;
  vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
  *in_RSI;
  pair<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>
  *in_RDI;
  vfloat4 v3;
  vfloat4 v2;
  vfloat4 v1;
  vfloat4 v0;
  size_t idx;
  size_t i_8;
  avector<Vec3ff> tangents_o;
  avector<Vec3ff> positions_o;
  size_t i_12;
  size_t i_11;
  size_t i_9;
  size_t i_10;
  size_t i_3;
  size_t i_2;
  Vec3fx *old_items;
  size_t i_1;
  size_t i;
  size_t i_7;
  size_t i_6;
  Vec3fx *old_items_1;
  size_t i_5;
  size_t i_4;
  size_t new_size_alloced;
  size_t new_size_alloced_1;
  void *in_stack_fffffffffffff6d8;
  vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>
  *in_stack_fffffffffffff6e0;
  vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>
  *in_stack_fffffffffffff6e8;
  undefined8 local_838;
  undefined8 uStack_830;
  undefined8 local_828;
  undefined8 uStack_820;
  undefined8 local_818;
  undefined8 uStack_810;
  undefined8 local_808;
  undefined8 uStack_800;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_788;
  undefined8 uStack_780;
  ulong local_770;
  ulong local_768;
  undefined1 local_760 [8];
  ulong local_758;
  ulong local_750;
  void *local_748;
  undefined1 local_730 [8];
  ulong local_728;
  ulong local_720;
  void *local_718;
  long local_710;
  vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
  *local_708;
  undefined1 *local_6f8;
  undefined1 *local_6f0;
  ulong local_6e8;
  undefined1 *local_6e0;
  ulong local_6d8;
  undefined1 *local_6d0;
  undefined8 *local_6c8;
  undefined8 *local_6c0;
  undefined8 *local_6b8;
  undefined8 *local_6b0;
  undefined8 *local_6a8;
  undefined8 *local_6a0;
  undefined8 *local_698;
  undefined8 *local_690;
  long local_688;
  long local_680;
  long local_678;
  long local_670;
  long local_668;
  long local_660;
  ulong local_658;
  long local_650;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 *local_630;
  undefined4 local_624;
  undefined8 *local_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 *local_600;
  undefined4 local_5f4;
  undefined8 *local_5f0;
  undefined8 *local_5e8;
  undefined8 *local_5e0;
  undefined8 *local_5d8;
  undefined8 *local_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 *local_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 *local_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 *local_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 *local_550;
  long local_548;
  undefined1 *local_540;
  long local_538;
  undefined1 *local_530;
  long local_528;
  undefined1 *local_520;
  long local_518;
  undefined1 *local_510;
  undefined8 *local_508;
  undefined8 *local_500;
  undefined8 *local_4f8;
  undefined8 *local_4f0;
  undefined8 *local_4e8;
  undefined8 *local_4e0;
  undefined8 *local_4d8;
  undefined8 *local_4d0;
  undefined1 *local_4c8;
  undefined1 *local_4b8;
  undefined8 *local_4a8;
  undefined8 *local_4a0;
  undefined8 *local_498;
  undefined8 *local_490;
  undefined8 *local_488;
  undefined8 *local_480;
  float local_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  undefined8 *local_460;
  float local_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  undefined8 *local_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 *local_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 *local_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 *local_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 *local_3c8;
  undefined8 *local_3c0;
  undefined8 *local_3b8;
  undefined8 *local_3b0;
  undefined8 *local_3a8;
  undefined8 *local_3a0;
  undefined8 *local_398;
  undefined8 *local_390;
  undefined8 *local_388;
  undefined8 *local_380;
  undefined8 *local_378;
  undefined8 *local_370;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  undefined8 *local_358;
  undefined8 *local_350;
  undefined8 *local_348;
  undefined8 *local_340;
  undefined8 *local_338;
  undefined8 *local_330;
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  undefined8 *local_310;
  undefined8 *local_308;
  undefined8 *local_300;
  undefined4 local_2f4;
  undefined8 *local_2f0;
  undefined4 local_2e4;
  undefined8 *local_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined4 local_298;
  undefined4 uStack_294;
  undefined4 uStack_290;
  undefined4 uStack_28c;
  undefined4 local_288;
  undefined4 local_278;
  undefined4 uStack_274;
  undefined4 uStack_270;
  undefined4 uStack_26c;
  undefined4 local_268;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  ulong local_200;
  undefined1 *local_1f8;
  ulong local_1e0;
  undefined1 *local_1d8;
  ulong local_1d0;
  void *local_1c8;
  undefined1 *local_1c0;
  ulong local_1a0;
  void *local_198;
  undefined1 *local_190;
  ulong local_170;
  ulong local_168;
  void *local_160;
  ulong local_158;
  ulong local_150;
  ulong local_148;
  ulong local_140;
  undefined1 *local_138;
  ulong local_130;
  undefined1 *local_128;
  undefined8 *local_120;
  undefined8 *local_118;
  void *local_110;
  void *local_108;
  ulong local_100;
  void *local_f8;
  undefined1 *local_f0;
  ulong local_e8;
  ulong local_e0;
  void *local_d8;
  ulong local_d0;
  ulong local_c8;
  ulong local_c0;
  ulong local_b8;
  undefined1 *local_b0;
  ulong local_a8;
  undefined1 *local_a0;
  undefined8 *local_98;
  undefined8 *local_90;
  void *local_88;
  void *local_80;
  ulong local_78;
  void *local_70;
  undefined1 *local_68;
  unsigned_long local_60 [2];
  ulong local_50;
  ulong local_48;
  undefined1 *local_40;
  ulong local_38;
  unsigned_long local_30 [2];
  ulong local_20;
  ulong local_18;
  undefined1 *local_10;
  ulong local_8;
  
  local_6f8 = local_730;
  local_728 = 0;
  local_720 = 0;
  local_718 = (void *)0x0;
  local_710 = in_RDX;
  local_708 = in_RSI;
  sVar4 = std::
          vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
          ::size(in_RSI);
  local_140 = sVar4 << 1;
  local_6d8 = local_140;
  local_6d0 = local_730;
  local_48 = local_140;
  local_40 = local_730;
  if (local_720 < local_140) {
    local_38 = local_140;
    if (local_720 != 0) {
      local_50 = local_720;
      while (local_50 < local_48) {
        local_60[1] = 1;
        local_60[0] = local_50 << 1;
        puVar5 = std::max<unsigned_long>(local_60 + 1,local_60);
        local_50 = *puVar5;
      }
      local_38 = local_50;
    }
  }
  else {
    local_38 = local_720;
  }
  local_148 = local_38;
  uVar2 = local_140;
  uVar3 = local_728;
  if (local_140 < local_728) {
    while (local_150 = uVar2, uVar3 = local_140, local_150 < local_728) {
      uVar2 = local_150 + 1;
    }
  }
  local_728 = uVar3;
  local_138 = local_730;
  if (local_38 == local_720) {
    for (local_158 = local_728; local_158 < local_140; local_158 = local_158 + 1) {
      local_110 = (void *)((long)local_718 + local_158 * 0x10);
    }
  }
  else {
    local_160 = local_718;
    local_130 = local_38;
    local_128 = local_730;
    local_718 = alignedMalloc((size_t)in_stack_fffffffffffff6e8,(size_t)in_stack_fffffffffffff6e0);
    for (local_168 = 0; local_168 < local_728; local_168 = local_168 + 1) {
      local_118 = (undefined8 *)((long)local_718 + local_168 * 0x10);
      local_120 = (undefined8 *)((long)local_160 + local_168 * 0x10);
      uVar1 = local_120[1];
      *local_118 = *local_120;
      local_118[1] = uVar1;
    }
    for (local_170 = local_728; local_170 < local_140; local_170 = local_170 + 1) {
      local_108 = (void *)((long)local_718 + local_170 * 0x10);
    }
    local_100 = local_720;
    local_f8 = local_160;
    local_f0 = local_730;
    alignedFree(in_stack_fffffffffffff6d8);
    local_720 = local_148;
  }
  local_6f0 = local_760;
  local_758 = 0;
  local_750 = 0;
  local_748 = (void *)0x0;
  local_728 = local_140;
  sVar4 = std::
          vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
          ::size(local_708);
  local_b8 = sVar4 << 1;
  local_6e8 = local_b8;
  local_6e0 = local_760;
  local_18 = local_b8;
  local_10 = local_760;
  if (local_750 < local_b8) {
    local_8 = local_b8;
    if (local_750 != 0) {
      local_20 = local_750;
      while (local_20 < local_18) {
        local_30[1] = 1;
        local_30[0] = local_20 << 1;
        puVar5 = std::max<unsigned_long>(local_30 + 1,local_30);
        local_20 = *puVar5;
      }
      local_8 = local_20;
    }
  }
  else {
    local_8 = local_750;
  }
  local_c0 = local_8;
  uVar2 = local_b8;
  uVar3 = local_758;
  if (local_b8 < local_758) {
    while (local_c8 = uVar2, uVar3 = local_b8, local_c8 < local_758) {
      uVar2 = local_c8 + 1;
    }
  }
  local_758 = uVar3;
  local_b0 = local_760;
  if (local_8 == local_750) {
    for (local_d0 = local_758; local_d0 < local_b8; local_d0 = local_d0 + 1) {
      local_88 = (void *)((long)local_748 + local_d0 * 0x10);
    }
  }
  else {
    local_d8 = local_748;
    local_a8 = local_8;
    local_a0 = local_760;
    local_748 = alignedMalloc((size_t)in_stack_fffffffffffff6e8,(size_t)in_stack_fffffffffffff6e0);
    for (local_e0 = 0; local_e0 < local_758; local_e0 = local_e0 + 1) {
      local_90 = (undefined8 *)((long)local_748 + local_e0 * 0x10);
      local_98 = (undefined8 *)((long)local_d8 + local_e0 * 0x10);
      uVar1 = local_98[1];
      *local_90 = *local_98;
      local_90[1] = uVar1;
    }
    for (local_e8 = local_758; local_e8 < local_b8; local_e8 = local_e8 + 1) {
      local_80 = (void *)((long)local_748 + local_e8 * 0x10);
    }
    local_78 = local_750;
    local_70 = local_d8;
    local_68 = local_760;
    alignedFree(in_stack_fffffffffffff6d8);
    local_750 = local_c0;
  }
  local_758 = local_b8;
  for (local_768 = 0; uVar2 = local_768,
      sVar4 = std::
              vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
              ::size(local_708), uVar2 < sVar4; local_768 = local_768 + 1) {
    pvVar6 = std::
             vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
             ::operator[](local_708,local_768);
    local_770 = (ulong)pvVar6->vertex;
    local_650 = local_710;
    local_698 = (undefined8 *)(*(long *)(local_710 + 0x18) + local_770 * 0x10);
    local_690 = &local_788;
    local_5c8 = *local_698;
    uStack_5c0 = local_698[1];
    local_420 = &local_788;
    local_668 = local_770 + 1;
    local_660 = local_710;
    local_6a8 = (undefined8 *)(*(long *)(local_710 + 0x18) + local_668 * 0x10);
    local_6a0 = &local_798;
    local_418 = *local_6a8;
    uStack_410 = local_6a8[1];
    local_400 = &local_798;
    local_678 = local_770 + 2;
    local_670 = local_710;
    local_6b8 = (undefined8 *)(*(long *)(local_710 + 0x18) + local_678 * 0x10);
    local_6b0 = &local_7a8;
    local_3f8 = *local_6b8;
    uStack_3f0 = local_6b8[1];
    local_3e0 = &local_7a8;
    local_688 = local_770 + 3;
    local_680 = local_710;
    local_6c8 = (undefined8 *)(*(long *)(local_710 + 0x18) + local_688 * 0x10);
    local_6c0 = &local_7b8;
    local_5a8 = *local_6c8;
    uStack_5a0 = local_6c8[1];
    local_3c8 = &local_7b8;
    local_5d0 = &local_788;
    local_5b0 = &local_7c8;
    local_518 = local_768 * 2;
    local_510 = local_730;
    local_4d0 = (undefined8 *)((long)local_718 + local_768 * 0x20);
    local_4d8 = &local_7c8;
    *local_4d0 = local_5c8;
    local_4d0[1] = uStack_5c0;
    local_5d8 = &local_7b8;
    local_590 = &local_7d8;
    local_528 = local_768 * 2 + 1;
    local_520 = local_730;
    local_4e0 = (undefined8 *)((long)local_718 + local_528 * 0x10);
    local_4e8 = &local_7d8;
    *local_4e0 = local_5a8;
    local_4e0[1] = uStack_5a0;
    local_480 = &local_808;
    local_488 = &local_798;
    local_490 = &local_788;
    local_248._0_4_ = (float)local_418;
    local_248._4_4_ = (float)((ulong)local_418 >> 0x20);
    uStack_240._0_4_ = (float)uStack_410;
    uStack_240._4_4_ = (float)((ulong)uStack_410 >> 0x20);
    local_258._0_4_ = (float)local_5c8;
    local_258._4_4_ = (float)((ulong)local_5c8 >> 0x20);
    uStack_250._0_4_ = (float)uStack_5c0;
    uStack_250._4_4_ = (float)((ulong)uStack_5c0 >> 0x20);
    local_478 = (float)local_248 - (float)local_258;
    fStack_474 = local_248._4_4_ - local_258._4_4_;
    fStack_470 = (float)uStack_240 - (float)uStack_250;
    fStack_46c = uStack_240._4_4_ - uStack_250._4_4_;
    local_460 = &local_808;
    local_5f0 = &local_7f8;
    local_5f4 = 0x40400000;
    local_600 = &local_808;
    local_2f0 = &local_618;
    local_2f4 = 0x40400000;
    local_268 = 0x40400000;
    local_278 = 0x40400000;
    uStack_274 = 0x40400000;
    uStack_270 = 0x40400000;
    uStack_26c = 0x40400000;
    local_618 = 0x4040000040400000;
    uStack_610 = 0x4040000040400000;
    local_370 = &local_7f8;
    local_378 = &local_618;
    local_2a8 = 0x4040000040400000;
    uStack_2a0 = 0x4040000040400000;
    local_2b8._0_4_ = (float)local_808;
    local_2b8._4_4_ = (float)((ulong)local_808 >> 0x20);
    uStack_2b0._0_4_ = (float)uStack_800;
    uStack_2b0._4_4_ = (float)((ulong)uStack_800 >> 0x20);
    local_368 = (float)local_2b8 * 3.0;
    fStack_364 = local_2b8._4_4_ * 3.0;
    fStack_360 = (float)uStack_2b0 * 3.0;
    fStack_35c = uStack_2b0._4_4_ * 3.0;
    local_358 = &local_7f8;
    local_588 = CONCAT44(fStack_364,local_368);
    uStack_580 = CONCAT44(fStack_35c,fStack_360);
    local_5e0 = &local_7f8;
    local_570 = &local_7e8;
    local_538 = local_768 * 2;
    local_530 = local_760;
    local_4f0 = (undefined8 *)((long)local_748 + local_768 * 0x20);
    local_4f8 = &local_7e8;
    *local_4f0 = local_588;
    local_4f0[1] = uStack_580;
    local_498 = &local_838;
    local_4a0 = &local_7b8;
    local_4a8 = &local_7a8;
    local_228._0_4_ = (float)local_5a8;
    local_228._4_4_ = (float)((ulong)local_5a8 >> 0x20);
    uStack_220._0_4_ = (float)uStack_5a0;
    uStack_220._4_4_ = (float)((ulong)uStack_5a0 >> 0x20);
    local_238._0_4_ = (float)local_3f8;
    local_238._4_4_ = (float)((ulong)local_3f8 >> 0x20);
    uStack_230._0_4_ = (float)uStack_3f0;
    uStack_230._4_4_ = (float)((ulong)uStack_3f0 >> 0x20);
    local_458 = (float)local_228 - (float)local_238;
    fStack_454 = local_228._4_4_ - local_238._4_4_;
    fStack_450 = (float)uStack_220 - (float)uStack_230;
    fStack_44c = uStack_220._4_4_ - uStack_230._4_4_;
    local_440 = &local_838;
    local_620 = &local_828;
    local_624 = 0x40400000;
    local_630 = &local_838;
    local_2e0 = &local_648;
    local_2e4 = 0x40400000;
    local_288 = 0x40400000;
    local_298 = 0x40400000;
    uStack_294 = 0x40400000;
    uStack_290 = 0x40400000;
    uStack_28c = 0x40400000;
    local_648 = 0x4040000040400000;
    uStack_640 = 0x4040000040400000;
    local_330 = &local_828;
    local_338 = &local_648;
    local_2c8 = 0x4040000040400000;
    uStack_2c0 = 0x4040000040400000;
    local_2d8._0_4_ = (float)local_838;
    local_2d8._4_4_ = (float)((ulong)local_838 >> 0x20);
    uStack_2d0._0_4_ = (float)uStack_830;
    uStack_2d0._4_4_ = (float)((ulong)uStack_830 >> 0x20);
    local_328 = (float)local_2d8 * 3.0;
    fStack_324 = local_2d8._4_4_ * 3.0;
    fStack_320 = (float)uStack_2d0 * 3.0;
    fStack_31c = uStack_2d0._4_4_ * 3.0;
    local_310 = &local_828;
    local_568 = CONCAT44(fStack_324,local_328);
    uStack_560 = CONCAT44(fStack_31c,fStack_320);
    local_5e8 = &local_828;
    local_550 = &local_818;
    local_548 = local_768 * 2 + 1;
    local_540 = local_760;
    local_500 = (undefined8 *)((long)local_748 + local_548 * 0x10);
    local_508 = &local_818;
    *local_500 = local_568;
    local_500[1] = uStack_560;
    local_658 = local_770;
    local_438 = local_5c8;
    uStack_430 = uStack_5c0;
    local_3d8 = local_5a8;
    uStack_3d0 = uStack_5a0;
    local_3c0 = local_698;
    local_3b8 = local_6a8;
    local_3b0 = local_6b8;
    local_3a8 = local_6c8;
    local_3a0 = local_490;
    local_398 = local_488;
    local_390 = local_4a8;
    local_388 = local_4a0;
    local_380 = local_600;
    local_350 = local_600;
    local_348 = local_378;
    local_340 = local_630;
    local_308 = local_630;
    local_300 = local_338;
    local_2d8 = local_838;
    uStack_2d0 = uStack_830;
    local_2b8 = local_808;
    uStack_2b0 = uStack_800;
    local_258 = local_5c8;
    uStack_250 = uStack_5c0;
    local_248 = local_418;
    uStack_240 = uStack_410;
    local_238 = local_3f8;
    uStack_230 = uStack_3f0;
    local_228 = local_5a8;
    uStack_220 = uStack_5a0;
    local_838 = CONCAT44(fStack_454,local_458);
    uStack_830 = CONCAT44(fStack_44c,fStack_450);
    local_828 = local_568;
    uStack_820 = uStack_560;
    local_818 = local_568;
    uStack_810 = uStack_560;
    local_808 = CONCAT44(fStack_474,local_478);
    uStack_800 = CONCAT44(fStack_46c,fStack_470);
    local_7f8 = local_588;
    uStack_7f0 = uStack_580;
    local_7e8 = local_588;
    uStack_7e0 = uStack_580;
    local_7d8 = local_5a8;
    uStack_7d0 = uStack_5a0;
    local_7c8 = local_5c8;
    uStack_7c0 = uStack_5c0;
    local_7b8 = local_5a8;
    uStack_7b0 = uStack_5a0;
    local_7a8 = local_3f8;
    uStack_7a0 = uStack_3f0;
    local_798 = local_418;
    uStack_790 = uStack_410;
    local_788 = local_5c8;
    uStack_780 = uStack_5c0;
  }
  std::
  make_pair<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>&,embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>&>
            (in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
  local_4c8 = local_760;
  for (local_1e0 = 0; local_1e0 < local_758; local_1e0 = local_1e0 + 1) {
  }
  local_1d0 = local_750;
  local_1c8 = local_748;
  local_1d8 = local_4c8;
  local_1c0 = local_4c8;
  alignedFree(in_stack_fffffffffffff6d8);
  local_748 = (void *)0x0;
  local_750 = 0;
  local_758 = 0;
  local_4b8 = local_730;
  for (local_200 = 0; local_200 < local_728; local_200 = local_200 + 1) {
  }
  local_1a0 = local_720;
  local_198 = local_718;
  local_1f8 = local_4b8;
  local_190 = local_4b8;
  alignedFree(in_stack_fffffffffffff6d8);
  *(undefined8 *)(local_4b8 + 0x18) = 0;
  *(undefined8 *)(local_4b8 + 0x10) = 0;
  *(undefined8 *)(local_4b8 + 8) = 0;
  return in_RDI;
}

Assistant:

std::pair<avector<Vec3ff>,avector<Vec3ff>> bezier_to_hermite_helper(const std::vector<SceneGraph::HairSetNode::Hair>& indices, const avector<Vec3ff>& positions)
  {
    avector<Vec3ff> positions_o; positions_o.resize(2*indices.size());
    avector<Vec3ff> tangents_o;  tangents_o.resize(2*indices.size());
    
    for (size_t i=0; i<indices.size(); i++) 
    {
      const size_t idx = indices[i].vertex;
      vfloat4 v0 = vfloat4::loadu(&positions[idx+0]);  
      vfloat4 v1 = vfloat4::loadu(&positions[idx+1]);
      vfloat4 v2 = vfloat4::loadu(&positions[idx+2]);
      vfloat4 v3 = vfloat4::loadu(&positions[idx+3]);
      positions_o[2*i+0] = Vec3ff(v0);
      positions_o[2*i+1] = Vec3ff(v3);
      tangents_o[2*i+0] = Vec3ff(3.0f*(v1-v0));
      tangents_o[2*i+1] = Vec3ff(3.0f*(v3-v2));
    }
    return std::make_pair(positions_o,tangents_o);
  }